

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadDistantLight(XMLLoader *this,Ref<embree::XML> *xml)

{
  _func_int **pp_Var1;
  undefined8 *in_RDX;
  XMLLoader *in_RSI;
  Node *in_RDI;
  float fVar2;
  Vec3fa VVar3;
  DistantLight light;
  float halfAngle;
  Vec3fa D;
  Vec3fa L;
  AffineSpace3fa space;
  Ref<embree::XML> *in_stack_000006e0;
  XMLLoader *in_stack_000006e8;
  float in_stack_fffffffffffffd24;
  DistantLight *in_stack_fffffffffffffd28;
  LightNodeImpl<embree::SceneGraph::DistantLight> *in_stack_fffffffffffffd30;
  DistantLight *in_stack_fffffffffffffd38;
  Ref<embree::XML> *xml_00;
  XMLLoader *this_00;
  Node *xml_01;
  string *in_stack_fffffffffffffdd8;
  XML *in_stack_fffffffffffffde0;
  allocator local_1b9;
  string local_1b8 [32];
  long *local_198;
  float local_18c;
  undefined8 local_188;
  undefined8 uStack_180;
  allocator local_171;
  string local_170 [32];
  Ref<embree::XML> local_150 [5];
  allocator local_121;
  string local_120 [32];
  long *local_100 [10];
  undefined8 *local_b0;
  undefined8 *local_98;
  undefined8 *local_90;
  undefined4 local_7c;
  undefined4 local_78;
  undefined4 local_74;
  undefined8 *local_70;
  long **local_68;
  Ref<embree::XML> *local_58;
  long **local_48;
  _func_int **local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined4 local_10;
  undefined4 local_c;
  undefined4 local_8;
  undefined4 local_4;
  
  xml_01 = in_RDI;
  local_b0 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,"AffineSpace",&local_121);
  XML::child(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  load<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>>>
            (in_stack_000006e8,in_stack_000006e0);
  local_68 = local_100;
  if (local_100[0] != (long *)0x0) {
    (**(code **)(*local_100[0] + 0x18))();
  }
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  local_90 = local_b0;
  this_00 = (XMLLoader *)*local_b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_170,"L",&local_171);
  XML::child(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  VVar3 = load<embree::Vec3fa>(in_RSI,(Ref<embree::XML> *)xml_01);
  xml_00 = local_150;
  local_58 = xml_00;
  if (local_150[0].ptr != (XML *)0x0) {
    (*((local_150[0].ptr)->super_RefCount)._vptr_RefCount[3])
              (VVar3.field_0._0_4_,VVar3.field_0._8_8_);
  }
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  local_70 = &local_188;
  local_74 = 0;
  local_78 = 0;
  local_7c = 0x3f800000;
  local_4 = 0;
  local_8 = 0x3f800000;
  local_c = 0;
  local_10 = 0;
  local_28 = 0;
  uStack_20 = 0x3f800000;
  local_188 = 0;
  uStack_180 = 0x3f800000;
  local_98 = local_b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b8,"halfAngle",&local_1b9);
  XML::child(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  fVar2 = load<float>(this_00,xml_00);
  local_48 = &local_198;
  if (local_198 != (long *)0x0) {
    (**(code **)(*local_198 + 0x18))();
  }
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  local_18c = fVar2;
  SceneGraph::DistantLight::DistantLight
            (in_stack_fffffffffffffd38,(Vec3fa *)in_stack_fffffffffffffd30,
             (Vec3fa *)in_stack_fffffffffffffd28,in_stack_fffffffffffffd24);
  pp_Var1 = (_func_int **)
            SceneGraph::LightNodeImpl<embree::SceneGraph::DistantLight>::operator_new(0x37be2f);
  SceneGraph::DistantLight::transform
            (in_stack_fffffffffffffd38,(AffineSpace3fa *)in_stack_fffffffffffffd30);
  SceneGraph::LightNodeImpl<embree::SceneGraph::DistantLight>::LightNodeImpl
            (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  (in_RDI->super_RefCount)._vptr_RefCount = pp_Var1;
  if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
    local_38 = pp_Var1;
    (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
  }
  return (Ref<embree::SceneGraph::Node>)xml_01;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadDistantLight(const Ref<XML>& xml) 
  {
    const AffineSpace3fa space = load<AffineSpace3fa>(xml->child("AffineSpace"));
    const Vec3fa L = load<Vec3fa>(xml->child("L"));
    const Vec3fa D = Vec3fa(0,0,1);
    const float halfAngle = load<float>(xml->child("halfAngle"));
    const SceneGraph::DistantLight light = SceneGraph::DistantLight(D,L,halfAngle);
    return new SceneGraph::LightNodeImpl<SceneGraph::DistantLight>(light.transform(space));
  }